

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O2

MPP_RET mpp_trie_last_info(MppTrie trie)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  short sVar17;
  int iVar18;
  MppTrieNode *pMVar19;
  MppTrieInfo *pMVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  MppTrie pvVar26;
  long lVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  short *psVar35;
  short *psVar36;
  undefined2 *puVar37;
  undefined8 *puVar38;
  undefined2 uVar39;
  uint uVar40;
  undefined4 *puVar41;
  short *psVar42;
  int local_6c;
  void *local_68;
  MppTrie local_60;
  uint local_54;
  long local_50;
  uint *local_48;
  ulong local_40;
  ulong local_38;
  
  if (trie == (MppTrie)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid NULL trie\n","mpp_trie_last_info");
    return MPP_ERR_NULL_PTR;
  }
  local_6c = *(int *)((long)trie + 0x18) + 3;
  mpp_trie_add_info(trie,"__name__",*trie,*(RK_U32 *)((long)trie + 8));
  local_60 = trie;
  mpp_trie_add_info(trie,"__info__",&local_6c,4);
  pvVar26 = local_60;
  local_48 = (uint *)((long)local_60 + 0x2c);
  mpp_trie_add_info(local_60,"__node__",local_48,4);
  local_68 = *(void **)((long)pvVar26 + 0x30);
  uVar3 = *(uint *)((long)pvVar26 + 0x2c);
  uVar34 = (ulong)uVar3;
  if ((mpp_trie_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_trie","shrink trie node start node %d info %d\n","mpp_trie_last_info",uVar34,
               (ulong)*(uint *)((long)pvVar26 + 0x18));
  }
  if ((mpp_trie_debug & 0x40) != 0) {
    mpp_trie_dump(pvVar26,"mpp_trie_last_info");
  }
  lVar30 = (long)local_68 + 0x34;
  pvVar25 = local_68;
  local_54 = uVar3;
  local_50 = lVar30;
  local_38 = uVar34;
LAB_0015fca2:
  uVar32 = uVar34 & 0xffffffff;
  puVar37 = (undefined2 *)((ulong)((int)uVar34 - 1) * 0x38 + lVar30);
  do {
    uVar31 = local_38;
    uVar40 = local_54;
    uVar34 = uVar34 - 1;
    if ((int)uVar32 < 2) {
      if ((mpp_trie_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_trie","shrink trie node finish count %d -> %d\n","mpp_trie_last_info",
                   local_38 & 0xffffffff,(ulong)local_54);
      }
      if ((mpp_trie_debug & 0x40) != 0) {
        mpp_trie_dump(local_60,"mpp_trie_last_info");
      }
      if ((char)mpp_trie_debug < '\0') {
        mpp_trie_check(local_60,"shrink merge tag stage");
      }
      if ((mpp_trie_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_trie","move trie node start to reduce memory %d -> %d\n",
                   "mpp_trie_last_info",uVar31 & 0xffffffff,(ulong)uVar40);
      }
      lVar30 = (long)(int)uVar40;
      psVar42 = (short *)((long)local_68 + 0x5e);
      uVar34 = 1;
      pvVar28 = local_68;
      pvVar25 = local_68;
      local_50 = lVar30;
      break;
    }
    uVar40 = (int)uVar32 - 1;
    uVar32 = (ulong)uVar40;
    sVar17 = puVar37[-7];
    uVar1 = *(ushort *)((long)pvVar25 + (long)sVar17 * 0x38 + 0x34);
    uVar31 = (ulong)uVar1;
    if (uVar1 < 2) {
      sVar2 = puVar37[-1];
      uVar33 = (uint)sVar2;
      if ((int)uVar33 < 0x10) {
        puVar41 = (undefined4 *)((long)sVar17 * 0x38 + (long)pvVar25);
        if ((int)puVar41[8] < 0) goto LAB_0015fd9e;
        if ((mpp_trie_debug & 0x20) != 0) {
          uVar4 = *(uint *)(puVar37 + -10);
          pcVar22 = "node %d:%d tag %d - %016llx stop shrinking for valid info node\n";
          goto LAB_0015fd6d;
        }
      }
      else if ((mpp_trie_debug & 0x20) != 0) {
        uVar4 = *(uint *)(puVar37 + -10);
        pcVar22 = "node %d:%d tag %d - %016llx stop shrinking for max tag len\n";
LAB_0015fd6d:
        uVar31 = *(ulong *)(puVar37 + -6);
        goto LAB_0015fd7f;
      }
    }
    else {
      if ((mpp_trie_debug & 0x20) == 0) goto LAB_0015fd92;
      uVar33 = (uint)sVar17;
      uVar4 = *(uint *)(puVar37 + -10);
      pcVar22 = "node %d:%d prev %d next count %d stop shrinking for multi next\n";
LAB_0015fd7f:
      _mpp_log_l(4,"mpp_trie",pcVar22,"mpp_trie_last_info",(ulong)uVar40,(ulong)uVar4,(ulong)uVar33,
                 uVar31);
      pvVar25 = local_68;
      lVar30 = local_50;
    }
LAB_0015fd92:
    puVar37 = puVar37 + -0x1c;
  } while( true );
LAB_0015ff49:
  pvVar25 = (void *)((long)pvVar25 + 0x38);
  if (lVar30 <= (long)uVar34) {
    *local_48 = local_54;
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node finish used %d\n","mpp_trie_last_info");
    }
    pvVar26 = local_60;
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(local_60,"mpp_trie_last_info");
    }
    if ((char)mpp_trie_debug < '\0') {
      mpp_trie_check(pvVar26,"shrink move node stage");
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","create user buffer start\n","mpp_trie_last_info");
    }
    iVar24 = *(int *)((long)pvVar26 + 0x2c) * 0x38;
    iVar18 = iVar24 + *(int *)((long)pvVar26 + 0x18) * 4 + *(int *)((long)pvVar26 + 0x4c) +
             *(int *)((long)pvVar26 + 0x54);
    *(int *)((long)pvVar26 + 0xc) = iVar18;
    pvVar25 = mpp_osal_calloc("mpp_trie_last_info",(long)iVar18);
    if (pvVar25 == (void *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to alloc trie buffer size %d\n",(char *)0x0,0);
      return MPP_NOK;
    }
    *(void **)((long)pvVar26 + 0x30) = pvVar25;
    memcpy(pvVar25,local_68,(long)iVar24);
    lVar30 = 0x10;
    local_6c = iVar24;
    for (lVar21 = 0; lVar21 < *(int *)((long)pvVar26 + 0x18); lVar21 = lVar21 + 1) {
      lVar23 = *(long *)((long)pvVar26 + 0x20);
      pcVar22 = (char *)((long)*(int *)(lVar23 + lVar30) + *(long *)((long)pvVar26 + 0x40));
      pMVar19 = mpp_trie_get_node(*(MppTrieNode **)((long)pvVar26 + 0x30),pcVar22);
      lVar27 = (long)local_6c;
      pMVar19->id = local_6c;
      uVar40 = *(uint *)(lVar23 + -0x10 + lVar30) & 0xfff;
      uVar3 = *(uint *)((long)pvVar25 + lVar27);
      *(uint *)((long)pvVar25 + lVar27) = uVar3 & 0xfffff000 | uVar40;
      uVar33 = (*(uint *)(lVar23 + -0xc + lVar30) & 0xfff) << 0xc;
      *(uint *)((long)pvVar25 + lVar27) = uVar3 & 0xff000000 | uVar40 | uVar33;
      *(uint *)((long)pvVar25 + lVar27) = *(int *)(lVar23 + -8 + lVar30) << 0x18 | uVar33 | uVar40;
      local_6c = local_6c + 4;
      strncpy((char *)((long)local_6c + (long)pvVar25),pcVar22,
              (ulong)*(byte *)((long)pvVar25 + lVar27 + 3));
      lVar29 = (long)local_6c + (ulong)*(byte *)((long)pvVar25 + lVar27 + 3);
      local_6c = (int)lVar29;
      memcpy((void *)(lVar29 + (long)pvVar25),
             (void *)((long)*(int *)(lVar23 + -4 + lVar30) + *(long *)((long)local_60 + 0x38)),
             (long)*(int *)(lVar23 + -0xc + lVar30));
      local_6c = local_6c + (*(uint *)((long)pvVar25 + lVar27) >> 0xc & 0xfff);
      lVar30 = lVar30 + 0x14;
      pvVar26 = local_60;
    }
    if (local_68 != (void *)0x0) {
      mpp_osal_free("mpp_trie_last_info",local_68);
    }
    if (*(void **)((long)pvVar26 + 0x20) != (void *)0x0) {
      mpp_osal_free("mpp_trie_last_info",*(void **)((long)pvVar26 + 0x20));
    }
    *(undefined8 *)((long)pvVar26 + 0x20) = 0;
    if (*(void **)((long)pvVar26 + 0x38) != (void *)0x0) {
      mpp_osal_free("mpp_trie_last_info",*(void **)((long)pvVar26 + 0x38));
    }
    *(undefined8 *)((long)pvVar26 + 0x38) = 0;
    if (*(void **)((long)pvVar26 + 0x40) != (void *)0x0) {
      mpp_osal_free("mpp_trie_last_info",*(void **)((long)pvVar26 + 0x40));
    }
    *(undefined8 *)((long)pvVar26 + 0x40) = 0;
    pMVar20 = mpp_trie_get_info_from_root(*(void **)((long)pvVar26 + 0x30),"__node__");
    if (pMVar20 == (MppTrieInfo *)0x0) {
      return MPP_OK;
    }
    *(uint *)(&pMVar20[1].field_0x0 + (byte)pMVar20->field_0x3) = *local_48;
    return MPP_OK;
  }
  if (*(short *)((long)pvVar28 + uVar34 * 0x38 + 0x24) == 0) {
    puVar38 = (undefined8 *)(uVar34 * 0x38 + (long)pvVar28);
    psVar35 = psVar42;
    for (uVar32 = uVar34; (long)uVar32 < (long)(int)uVar3; uVar32 = uVar32 + 1) {
      sVar17 = psVar35[-1];
      if (sVar17 != 0) {
        if ((mpp_trie_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_trie","move node %d to %d prev %d\n","mpp_trie_last_info",uVar32,
                     uVar34 & 0xffffffff,(ulong)(uint)(int)*psVar35);
          sVar17 = psVar35[-1];
          pvVar28 = local_68;
          lVar30 = local_50;
        }
        psVar36 = psVar35 + -0x13;
        lVar21 = 0;
        goto LAB_0015fff0;
      }
      psVar35 = psVar35 + 0x1c;
    }
  }
  goto LAB_0015ff5f;
  while (lVar23 = lVar21 + 1, lVar27 = lVar21 * 2, lVar21 = lVar23,
        *(short *)((long)pvVar28 + lVar27 + (long)*psVar35 * 0x38) != sVar17) {
LAB_0015fff0:
    uVar39 = (undefined2)uVar34;
    if (lVar21 == 0x10) goto LAB_00160009;
  }
  *(undefined2 *)((long)pvVar28 + lVar23 * 2 + (long)*psVar35 * 0x38 + -2) = uVar39;
LAB_00160009:
  uVar12 = *(undefined8 *)psVar36;
  uVar13 = *(undefined8 *)(psVar35 + -0xf);
  uVar14 = *(undefined8 *)(psVar35 + -0xb);
  uVar15 = *(undefined8 *)(psVar35 + -7);
  uVar16 = *(undefined8 *)(psVar35 + 1);
  puVar38[4] = *(undefined8 *)(psVar35 + -3);
  puVar38[5] = uVar16;
  puVar38[6] = *(undefined8 *)(psVar35 + 5);
  puVar38[2] = uVar14;
  puVar38[3] = uVar15;
  *puVar38 = uVar12;
  puVar38[1] = uVar13;
  *(undefined2 *)((long)puVar38 + 0x24) = uVar39;
  psVar35[-3] = 0;
  psVar35[-2] = 0;
  psVar35[-1] = 0;
  psVar35[0] = 0;
  psVar35[1] = 0;
  psVar35[2] = 0;
  psVar35[3] = 0;
  psVar35[4] = 0;
  psVar35[-0xb] = 0;
  psVar35[-10] = 0;
  psVar35[-9] = 0;
  psVar35[-8] = 0;
  psVar35[-7] = 0;
  psVar35[-6] = 0;
  psVar35[-5] = 0;
  psVar35[-4] = 0;
  psVar36[0] = 0;
  psVar36[1] = 0;
  psVar36[2] = 0;
  psVar36[3] = 0;
  psVar35[-0xf] = 0;
  psVar35[-0xe] = 0;
  psVar35[-0xd] = 0;
  psVar35[-0xc] = 0;
  psVar35[5] = 0;
  psVar35[6] = 0;
  psVar35[7] = 0;
  psVar35[8] = 0;
  for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
    lVar23 = (long)*(short *)((long)pvVar25 + lVar21 * 2);
    if (lVar23 != 0) {
      *(undefined2 *)((long)pvVar28 + lVar23 * 0x38 + 0x26) = uVar39;
    }
  }
LAB_0015ff5f:
  uVar34 = uVar34 + 1;
  psVar42 = psVar42 + 0x1c;
  goto LAB_0015ff49;
LAB_0015fd9e:
  uVar33 = *(uint *)(puVar37 + -10);
  puVar41[8] = uVar33;
  *(short *)((long)puVar41 + 0x32) = sVar2 + 1;
  uVar32 = (ulong)(ushort)puVar37[-2] << ((*(byte *)(puVar37 + -1) & 0xf) << 2) |
           *(ulong *)(puVar37 + -6);
  *(ulong *)(puVar41 + 10) = uVar32;
  *(undefined2 *)(puVar41 + 0xd) = *puVar37;
  uVar5 = *(undefined4 *)(puVar37 + -0x1a);
  uVar6 = *(undefined4 *)(puVar37 + -0x18);
  uVar7 = *(undefined4 *)(puVar37 + -0x16);
  uVar8 = *(undefined4 *)(puVar37 + -0x14);
  uVar9 = *(undefined4 *)(puVar37 + -0x10);
  uVar10 = *(undefined4 *)(puVar37 + -0xe);
  uVar11 = *(undefined4 *)(puVar37 + -0xc);
  puVar41[4] = *(undefined4 *)(puVar37 + -0x12);
  puVar41[5] = uVar9;
  puVar41[6] = uVar10;
  puVar41[7] = uVar11;
  *puVar41 = uVar5;
  puVar41[1] = uVar6;
  puVar41[2] = uVar7;
  puVar41[3] = uVar8;
  if ((mpp_trie_debug & 0x20) != 0) {
    local_40 = (ulong)(uint)(int)*(short *)(puVar41 + 9);
    _mpp_log_l(4,"mpp_trie","node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
               "mpp_trie_last_info",(ulong)uVar40,(ulong)uVar33,local_40,
               (ulong)*(ushort *)(puVar41 + 0xc),*(undefined8 *)(puVar37 + -6),uVar32);
    pvVar25 = local_68;
    lVar30 = local_50;
  }
  for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
    lVar23 = (long)*(short *)((long)puVar41 + lVar21 * 2);
    if (lVar23 != 0) {
      *(short *)((long)pvVar25 + lVar23 * 0x38 + 0x26) = sVar17;
    }
  }
  *(undefined8 *)(puVar37 + -10) = 0;
  *(undefined8 *)(puVar37 + -6) = 0;
  *(undefined8 *)(puVar37 + -0x12) = 0;
  *(undefined8 *)(puVar37 + -0xe) = 0;
  *(undefined8 *)(puVar37 + -0x1a) = 0;
  *(undefined8 *)(puVar37 + -0x16) = 0;
  *(undefined8 *)(puVar37 + -2) = 0;
  *(undefined4 *)(puVar37 + -10) = 0xffffffff;
  local_54 = local_54 - 1;
  goto LAB_0015fca2;
}

Assistant:

MPP_RET mpp_trie_last_info(MppTrie trie)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *root;
    MppTrieNode *node;
    char *buf;
    RK_S32 node_count;
    RK_S32 node_valid;
    RK_S32 nodes_size;
    RK_S32 len = 0;
    RK_S32 pos = 0;
    RK_S32 i;
    RK_S32 j;

    if (!trie) {
        mpp_err_f("invalid NULL trie\n");
        return MPP_ERR_NULL_PTR;
    }

    /* write trie self entry info */
    pos = p->info_used + 3;
    mpp_trie_add_info(trie, "__name__", p->name, p->name_len);
    mpp_trie_add_info(trie, "__info__", &pos, sizeof(pos));
    /* NOTE: node count need to be update after shrinking */
    mpp_trie_add_info(trie, "__node__", &p->node_used, sizeof(p->node_used));

    root = p->nodes;
    node_count = p->node_used;
    node_valid = node_count;

    trie_dbg_last("shrink trie node start node %d info %d\n", node_count, p->info_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    for (i = node_count - 1; i > 0; i--) {
        MppTrieNode *prev;
        RK_S32 prev_idx;

        node = &root[i];
        prev_idx = node->prev;
        prev = &root[prev_idx];

        if (prev->next_cnt > 1) {
            trie_dbg_last("node %d:%d prev %d next count %d stop shrinking for multi next\n",
                          i, node->id, prev_idx, prev->next_cnt);
            continue;
        }

        if (node->tag_len >= (RK_S16)MPP_TRIE_TAG_LEN_MAX) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for max tag len\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        if (prev->id >= 0) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for valid info node\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        prev->id = node->id;
        /* NOTE: do NOT increase tag length on root node */
        prev->tag_len = node->tag_len + 1;
        prev->tag_val = ((RK_U64)node->key << (node->tag_len * 4)) | node->tag_val;
        prev->next_cnt = node->next_cnt;
        memcpy(prev->next, node->next, sizeof(node->next));

        trie_dbg_last("node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                      i, node->id, prev->idx, prev->key, node->tag_val, prev->tag_val);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (!prev->next[j])
                continue;

            root[prev->next[j]].prev = prev_idx;
        }

        memset(node, 0, sizeof(*node));
        node->id = INVALID_NODE_ID;
        node_valid--;
    }

    trie_dbg_last("shrink trie node finish count %d -> %d\n", node_count, node_valid);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink merge tag stage");

    trie_dbg_last("move trie node start to reduce memory %d -> %d\n", node_count, node_valid);

    for (i = 1; i < node_valid; i++) {
        node = &root[i];

        /* skip valid node */
        if (node->idx)
            continue;

        for (j = i; j < node_count; j++) {
            MppTrieNode *tmp = &root[j];
            MppTrieNode *prev;
            RK_S32 k;

            /* skip empty node */
            if (!tmp->idx)
                continue;

            trie_dbg_last("move node %d to %d prev %d\n", j, i, tmp->prev);

            prev = &root[tmp->prev];

            /* relink previous node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (prev->next[k] != tmp->idx)
                    continue;

                prev->next[k] = i;
                break;
            }

            memcpy(node, tmp, sizeof(*node));
            node->idx = i;
            memset(tmp, 0, sizeof(*tmp));

            /* relink next node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (!node->next[k])
                    continue;

                root[node->next[k]].prev = i;
            }

            break;
        }
    }

    p->node_used = node_valid;

    trie_dbg_last("move trie node finish used %d\n", p->node_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink move node stage");

    trie_dbg_last("create user buffer start\n");

    nodes_size = sizeof(MppTrieNode) * p->node_used;
    p->buf_size = nodes_size + sizeof(MppTrieInfo) * p->info_used + p->info_buf_pos + p->name_buf_pos;

    buf = mpp_calloc_size(char, p->buf_size);
    if (!buf) {
        mpp_loge("failed to alloc trie buffer size %d\n", len);
        return MPP_NOK;
    }

    p->nodes = (MppTrieNode *)buf;
    memcpy(p->nodes, root, nodes_size);
    pos = nodes_size;

    for (i = 0; i < p->info_used; i++) {
        MppTrieInfoInt *src = &p->info[i];
        MppTrieInfo *dst;
        const char *name = (char *)p->name_buf + src->name_offset;

        node = mpp_trie_get_node(p->nodes, name);
        node->id = pos;

        /* reserve node info */
        dst = (MppTrieInfo *)(buf + pos);
        dst->index = src->index;
        dst->ctx_len = src->ctx_len;
        dst->str_len = src->str_len;
        pos += sizeof(MppTrieInfo);

        /* copy info name */
        strncpy(buf + pos, name, dst->str_len);
        pos += dst->str_len;

        /* reserve user context space */
        memcpy(buf + pos, (char *)p->info_buf + src->ctx_offset, src->ctx_len);
        pos += dst->ctx_len;
    }

    MPP_FREE(root);
    MPP_FREE(p->info);
    MPP_FREE(p->info_buf);
    MPP_FREE(p->name_buf);

    /* NOTE: udpate final shrinked node count */
    {
        MppTrieInfo *info = mpp_trie_get_info_from_root(p->nodes, "__node__");

        if (info)
            *(RK_U32 *)mpp_trie_info_ctx(info) = p->node_used;
    }

    return MPP_OK;
}